

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O0

CaseProd *
slang::ast::RandSeqProductionSymbol::createCaseProd(RsCaseSyntax *syntax,ASTContext *context)

{
  SyntaxNode *this;
  span<const_slang::syntax::ExpressionSyntax_*const,_18446744073709551615UL> expressions_00;
  ulong uVar1;
  SyntaxList<slang::syntax::RsCaseItemSyntax> *args;
  iterator item_00;
  iterator this_00;
  bool bVar2;
  int iVar3;
  iterator ppRVar4;
  StandardRsCaseItemSyntax *pSVar5;
  RsProdItemSyntax *pRVar6;
  DefaultRsCaseItemSyntax *pDVar7;
  logic_error *this_01;
  ExpressionSyntax *pEVar8;
  size_t sVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  CaseProd *pCVar10;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *src_00;
  iterator iVar11;
  SmallVectorBase<const_slang::ast::Expression_*> *in_stack_fffffffffffff958;
  span<slang::ast::RandSeqProductionSymbol::CaseItem,_18446744073709551615UL> local_5d8;
  span<const_slang::ast::Expression_*,_18446744073709551615UL> local_5c8;
  CaseItem local_5b8;
  ulong local_588;
  size_t i;
  StandardRsCaseItemSyntax *sci_1;
  RsCaseItemSyntax *item_1;
  iterator __end2_1;
  iterator __begin2_1;
  SyntaxList<slang::syntax::RsCaseItemSyntax> *__range2_1;
  Expression *expr;
  iterator prodIt;
  iterator boundIt;
  Compilation *comp;
  SmallVector<const_slang::ast::Expression_*,_5UL> group;
  SmallVector<slang::ast::RandSeqProductionSymbol::CaseItem,_8UL> items;
  pointer ppEStack_358;
  undefined1 local_350 [8];
  SmallVector<const_slang::ast::Expression_*,_5UL> bound;
  string local_308;
  allocator<char> local_2e1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  ProdItem local_240;
  ExpressionSyntax *local_220;
  ExpressionSyntax *es;
  iterator __end4;
  iterator __begin4;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *__range4;
  ProdItem pi;
  StandardRsCaseItemSyntax *sci;
  RsCaseItemSyntax *item;
  iterator __end2;
  iterator __begin2;
  SyntaxList<slang::syntax::RsCaseItemSyntax> *__range2;
  optional<slang::ast::RandSeqProductionSymbol::ProdItem> defItem;
  SmallVector<slang::ast::RandSeqProductionSymbol::ProdItem,_8UL> prods;
  SmallVector<const_slang::syntax::ExpressionSyntax_*,_5UL> expressions;
  ASTContext *context_local;
  RsCaseSyntax *syntax_local;
  
  SmallVector<const_slang::syntax::ExpressionSyntax_*,_5UL>::SmallVector
            ((SmallVector<const_slang::syntax::ExpressionSyntax_*,_5UL> *)(prods.stackBase + 0xd8));
  SmallVector<slang::ast::RandSeqProductionSymbol::ProdItem,_8UL>::SmallVector
            ((SmallVector<slang::ast::RandSeqProductionSymbol::ProdItem,_8UL> *)
             &defItem.
              super__Optional_base<slang::ast::RandSeqProductionSymbol::ProdItem,_true,_true>.
              _M_payload.super__Optional_payload_base<slang::ast::RandSeqProductionSymbol::ProdItem>
              ._M_engaged);
  std::optional<slang::ast::RandSeqProductionSymbol::ProdItem>::optional
            ((optional<slang::ast::RandSeqProductionSymbol::ProdItem> *)&__range2);
  __end2 = nonstd::span_lite::span<slang::syntax::RsCaseItemSyntax_*,_18446744073709551615UL>::begin
                     (&(syntax->items).
                       super_span<slang::syntax::RsCaseItemSyntax_*,_18446744073709551615UL>);
  ppRVar4 = nonstd::span_lite::span<slang::syntax::RsCaseItemSyntax_*,_18446744073709551615UL>::end
                      (&(syntax->items).
                        super_span<slang::syntax::RsCaseItemSyntax_*,_18446744073709551615UL>);
  do {
    if (__end2 == ppRVar4) {
      SmallVector<const_slang::ast::Expression_*,_5UL>::SmallVector
                ((SmallVector<const_slang::ast::Expression_*,_5UL> *)local_350);
      pEVar8 = not_null<slang::syntax::ExpressionSyntax_*>::operator*(&syntax->expr);
      nonstd::span_lite::span<const_slang::syntax::ExpressionSyntax_*const,_18446744073709551615UL>
      ::span<slang::SmallVector<const_slang::syntax::ExpressionSyntax_*,_5UL>,_0>
                ((span<const_slang::syntax::ExpressionSyntax_*const,_18446744073709551615UL> *)
                 (items.stackBase + 0x148),
                 (SmallVector<const_slang::syntax::ExpressionSyntax_*,_5UL> *)
                 (prods.stackBase + 0xd8));
      expressions_00.size_ = (size_type)local_350;
      expressions_00.data_ = ppEStack_358;
      Expression::bindMembershipExpressions
                ((Expression *)context,(ASTContext *)0x74,Unknown,false,true,true,SUB81(pEVar8,0),
                 (ExpressionSyntax *)items.stackBase._328_8_,expressions_00,
                 in_stack_fffffffffffff958);
      SmallVector<slang::ast::RandSeqProductionSymbol::CaseItem,_8UL>::SmallVector
                ((SmallVector<slang::ast::RandSeqProductionSymbol::CaseItem,_8UL> *)
                 (group.stackBase + 0x18));
      SmallVector<const_slang::ast::Expression_*,_5UL>::SmallVector
                ((SmallVector<const_slang::ast::Expression_*,_5UL> *)&comp);
      boundIt = (iterator)ASTContext::getCompilation(context);
      prodIt = (iterator)
               SmallVectorBase<const_slang::ast::Expression_*>::begin
                         ((SmallVectorBase<const_slang::ast::Expression_*> *)local_350);
      expr = (Expression *)
             SmallVectorBase<slang::ast::RandSeqProductionSymbol::ProdItem>::begin
                       ((SmallVectorBase<slang::ast::RandSeqProductionSymbol::ProdItem> *)
                        &defItem.
                         super__Optional_base<slang::ast::RandSeqProductionSymbol::ProdItem,_true,_true>
                         ._M_payload.
                         super__Optional_payload_base<slang::ast::RandSeqProductionSymbol::ProdItem>
                         ._M_engaged);
      __range2_1 = *(SyntaxList<slang::syntax::RsCaseItemSyntax> **)prodIt;
      __begin2_1 = (iterator)&syntax->items;
      prodIt = (iterator)&prodIt->target;
      __end2_1 = nonstd::span_lite::span<slang::syntax::RsCaseItemSyntax_*,_18446744073709551615UL>
                 ::begin(&(syntax->items).
                          super_span<slang::syntax::RsCaseItemSyntax_*,_18446744073709551615UL>);
      item_1 = (RsCaseItemSyntax *)
               nonstd::span_lite::span<slang::syntax::RsCaseItemSyntax_*,_18446744073709551615UL>::
               end((span<slang::syntax::RsCaseItemSyntax_*,_18446744073709551615UL> *)
                   (__begin2_1 + 4));
      src_00 = extraout_RDX;
      for (; this_00 = boundIt, args = __range2_1, (RsCaseItemSyntax *)__end2_1 != item_1;
          __end2_1 = __end2_1 + 1) {
        sci_1 = (StandardRsCaseItemSyntax *)*__end2_1;
        if ((sci_1->super_RsCaseItemSyntax).super_SyntaxNode.kind == StandardRsCaseItem) {
          i = (size_t)slang::syntax::SyntaxNode::as<slang::syntax::StandardRsCaseItemSyntax>
                                ((SyntaxNode *)sci_1);
          for (local_588 = 0; uVar1 = local_588,
              sVar9 = slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::size
                                ((SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)(i + 0x10))
              , item_00 = prodIt, uVar1 < sVar9; local_588 = local_588 + 1) {
            prodIt = (iterator)&prodIt->target;
            SmallVectorBase<const_slang::ast::Expression_*>::push_back
                      ((SmallVectorBase<const_slang::ast::Expression_*> *)&comp,
                       (Expression **)item_00);
          }
          iVar3 = SmallVectorBase<const_slang::ast::Expression_*>::copy
                            ((SmallVectorBase<const_slang::ast::Expression_*> *)&comp,
                             (EVP_PKEY_CTX *)boundIt,src);
          local_5c8.data_ = (pointer)CONCAT44(extraout_var,iVar3);
          nonstd::span_lite::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::
          span<const_slang::ast::Expression_*,_18446744073709551615UL,_0>
                    (&local_5b8.expressions,&local_5c8);
          local_5b8.item.super_ProdBase.kind = expr->kind;
          local_5b8.item._4_4_ = *(undefined4 *)&expr->field_0x4;
          local_5b8.item.target = (RandSeqProductionSymbol *)(expr->type).ptr;
          local_5b8.item.args.data_ = (pointer)expr->constant;
          local_5b8.item.args.size_ = (size_type)expr->syntax;
          expr = (Expression *)&expr->sourceRange;
          SmallVectorBase<slang::ast::RandSeqProductionSymbol::CaseItem>::push_back
                    ((SmallVectorBase<slang::ast::RandSeqProductionSymbol::CaseItem> *)
                     (group.stackBase + 0x18),&local_5b8);
          SmallVectorBase<const_slang::ast::Expression_*>::clear
                    ((SmallVectorBase<const_slang::ast::Expression_*> *)&comp);
          src_00 = extraout_RDX_00;
        }
      }
      iVar3 = SmallVectorBase<slang::ast::RandSeqProductionSymbol::CaseItem>::copy
                        ((SmallVectorBase<slang::ast::RandSeqProductionSymbol::CaseItem> *)
                         (group.stackBase + 0x18),(EVP_PKEY_CTX *)boundIt,src_00);
      local_5d8.data_ = (pointer)CONCAT44(extraout_var_00,iVar3);
      pCVar10 = BumpAllocator::
                emplace<slang::ast::RandSeqProductionSymbol::CaseProd,slang::ast::Expression_const&,nonstd::span_lite::span<slang::ast::RandSeqProductionSymbol::CaseItem,18446744073709551615ul>,std::optional<slang::ast::RandSeqProductionSymbol::ProdItem>&>
                          ((BumpAllocator *)this_00,(Expression *)args,&local_5d8,
                           (optional<slang::ast::RandSeqProductionSymbol::ProdItem> *)&__range2);
      SmallVector<const_slang::ast::Expression_*,_5UL>::~SmallVector
                ((SmallVector<const_slang::ast::Expression_*,_5UL> *)&comp);
      SmallVector<slang::ast::RandSeqProductionSymbol::CaseItem,_8UL>::~SmallVector
                ((SmallVector<slang::ast::RandSeqProductionSymbol::CaseItem,_8UL> *)
                 (group.stackBase + 0x18));
      SmallVector<const_slang::ast::Expression_*,_5UL>::~SmallVector
                ((SmallVector<const_slang::ast::Expression_*,_5UL> *)local_350);
      SmallVector<slang::ast::RandSeqProductionSymbol::ProdItem,_8UL>::~SmallVector
                ((SmallVector<slang::ast::RandSeqProductionSymbol::ProdItem,_8UL> *)
                 &defItem.
                  super__Optional_base<slang::ast::RandSeqProductionSymbol::ProdItem,_true,_true>.
                  _M_payload.
                  super__Optional_payload_base<slang::ast::RandSeqProductionSymbol::ProdItem>.
                  _M_engaged);
      SmallVector<const_slang::syntax::ExpressionSyntax_*,_5UL>::~SmallVector
                ((SmallVector<const_slang::syntax::ExpressionSyntax_*,_5UL> *)
                 (prods.stackBase + 0xd8));
      return pCVar10;
    }
    this = &(*__end2)->super_SyntaxNode;
    if (this->kind == DefaultRsCaseItem) {
      bVar2 = std::optional::operator_cast_to_bool((optional *)&__range2);
      if (!bVar2) {
        pDVar7 = slang::syntax::SyntaxNode::as<slang::syntax::DefaultRsCaseItemSyntax>(this);
        pRVar6 = not_null<slang::syntax::RsProdItemSyntax_*>::operator*(&pDVar7->item);
        createProdItem(&local_240,pRVar6,context);
        std::optional<slang::ast::RandSeqProductionSymbol::ProdItem>::operator=
                  ((optional<slang::ast::RandSeqProductionSymbol::ProdItem> *)&__range2,&local_240);
      }
    }
    else {
      if (this->kind != StandardRsCaseItem) {
        bound.stackBase[0x1f] = '\x01';
        this_01 = (logic_error *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2e0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/symbols/MemberSymbols.cpp"
                   ,&local_2e1);
        std::operator+(&local_2c0,&local_2e0,":");
        std::__cxx11::to_string(&local_308,0x589);
        std::operator+(&local_2a0,&local_2c0,&local_308);
        std::operator+(&local_280,&local_2a0,": ");
        std::operator+(&local_260,&local_280,"Default case should be unreachable!");
        std::logic_error::logic_error(this_01,(string *)&local_260);
        bound.stackBase[0x1f] = '\0';
        __cxa_throw(this_01,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      pSVar5 = slang::syntax::SyntaxNode::as<slang::syntax::StandardRsCaseItemSyntax>(this);
      pRVar6 = not_null<slang::syntax::RsProdItemSyntax_*>::operator*(&pSVar5->item);
      createProdItem((ProdItem *)&__range4,pRVar6,context);
      iVar11 = slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::begin
                         (&pSVar5->expressions);
      __end4.index = (size_t)iVar11.list;
      iVar11 = slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::end
                         (&pSVar5->expressions);
      while( true ) {
        __end4.list = (ParentList *)iVar11.index;
        es = (ExpressionSyntax *)iVar11.list;
        bVar2 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<slang::syntax::ExpressionSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::ExpressionSyntax_*,_unsigned_long,_slang::syntax::ExpressionSyntax_**,_slang::syntax::ExpressionSyntax_*&>
                ::operator!=((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<slang::syntax::ExpressionSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::ExpressionSyntax_*,_unsigned_long,_slang::syntax::ExpressionSyntax_**,_slang::syntax::ExpressionSyntax_*&>
                              *)&__end4.index,
                             (iterator_base<slang::syntax::ExpressionSyntax_*> *)&es);
        if (!bVar2) break;
        local_220 = slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::
                    iterator_base<slang::syntax::ExpressionSyntax_*>::operator*
                              ((iterator_base<slang::syntax::ExpressionSyntax_*> *)&__end4.index);
        SmallVectorBase<const_slang::syntax::ExpressionSyntax_*>::push_back
                  ((SmallVectorBase<const_slang::syntax::ExpressionSyntax_*> *)
                   (prods.stackBase + 0xd8),&local_220);
        SmallVectorBase<slang::ast::RandSeqProductionSymbol::ProdItem>::push_back
                  ((SmallVectorBase<slang::ast::RandSeqProductionSymbol::ProdItem> *)
                   &defItem.
                    super__Optional_base<slang::ast::RandSeqProductionSymbol::ProdItem,_true,_true>.
                    _M_payload.
                    super__Optional_payload_base<slang::ast::RandSeqProductionSymbol::ProdItem>.
                    _M_engaged,(ProdItem *)&__range4);
        iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<slang::syntax::ExpressionSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::ExpressionSyntax_*,_unsigned_long,_slang::syntax::ExpressionSyntax_**,_slang::syntax::ExpressionSyntax_*&>
        ::operator++((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<slang::syntax::ExpressionSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::ExpressionSyntax_*,_unsigned_long,_slang::syntax::ExpressionSyntax_**,_slang::syntax::ExpressionSyntax_*&>
                      *)&__end4.index);
        iVar11.index = (size_t)__end4.list;
        iVar11.list = (ParentList *)es;
      }
    }
    __end2 = __end2 + 1;
  } while( true );
}

Assistant:

const RandSeqProductionSymbol::CaseProd& RandSeqProductionSymbol::createCaseProd(
    const RsCaseSyntax& syntax, const ASTContext& context) {

    SmallVector<const ExpressionSyntax*> expressions;
    SmallVector<ProdItem, 8> prods;
    std::optional<ProdItem> defItem;

    for (auto item : syntax.items) {
        switch (item->kind) {
            case SyntaxKind::StandardRsCaseItem: {
                auto& sci = item->as<StandardRsCaseItemSyntax>();
                auto pi = createProdItem(*sci.item, context);
                for (auto es : sci.expressions) {
                    expressions.push_back(es);
                    prods.push_back(pi);
                }
                break;
            }
            case SyntaxKind::DefaultRsCaseItem:
                // The parser already errored for duplicate defaults,
                // so just ignore if it happens here.
                if (!defItem)
                    defItem = createProdItem(*item->as<DefaultRsCaseItemSyntax>().item, context);
                break;
            default:
                ASSUME_UNREACHABLE;
        }
    }

    SmallVector<const Expression*> bound;
    Expression::bindMembershipExpressions(context, TokenKind::CaseKeyword,
                                          /* requireIntegral */ false,
                                          /* unwrapUnpacked */ false,
                                          /* allowTypeReferences */ true, /* allowOpenRange */ true,
                                          *syntax.expr, expressions, bound);

    SmallVector<CaseItem, 8> items;
    SmallVector<const Expression*> group;
    auto& comp = context.getCompilation();
    auto boundIt = bound.begin();
    auto prodIt = prods.begin();
    auto expr = *boundIt++;

    for (auto item : syntax.items) {
        switch (item->kind) {
            case SyntaxKind::StandardRsCaseItem: {
                auto& sci = item->as<StandardRsCaseItemSyntax>();
                for (size_t i = 0; i < sci.expressions.size(); i++)
                    group.push_back(*boundIt++);

                items.push_back({group.copy(comp), *prodIt++});
                group.clear();
                break;
            }
            default:
                break;
        }
    }

    return *comp.emplace<CaseProd>(*expr, items.copy(comp), defItem);
}